

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.h
# Opt level: O1

cmCommand * __thiscall cmTryRunCommand::Clone(cmTryRunCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x150);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1[1]._vptr_cmCommand = (_func_int **)&pcVar1[1].Error;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar1[1].Error._M_dataplus._M_p = 0;
  pcVar1[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar1 + 2);
  *(undefined8 *)((long)&pcVar1[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar1[2]._vptr_cmCommand = 0;
  pcVar1[2].Error._M_dataplus._M_p = (pointer)&pcVar1[2].Error.field_2;
  pcVar1[2].Error._M_string_length = 0;
  pcVar1[2].Error.field_2._M_local_buf[0] = '\0';
  pcVar1[3].Makefile = (cmMakefile *)0x0;
  pcVar1[3].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar1[3].Error._M_string_length = 0;
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmTryRunCommand_006f4dc8;
  pcVar1[3].Error.field_2._M_allocated_capacity = (size_type)(pcVar1 + 4);
  *(undefined8 *)((long)&pcVar1[3].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar1[4]._vptr_cmCommand = 0;
  pcVar1[4].Error._M_dataplus._M_p = (pointer)&pcVar1[4].Error.field_2;
  pcVar1[4].Error._M_string_length = 0;
  pcVar1[4].Error.field_2._M_local_buf[0] = '\0';
  pcVar1[5]._vptr_cmCommand = (_func_int **)&pcVar1[5].Error;
  pcVar1[5].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar1[5].Error._M_dataplus._M_p = 0;
  pcVar1[5].Error.field_2._M_allocated_capacity = (size_type)(pcVar1 + 6);
  *(undefined8 *)((long)&pcVar1[5].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar1[6]._vptr_cmCommand = 0;
  pcVar1[6].Error._M_dataplus._M_p = (pointer)&pcVar1[6].Error.field_2;
  pcVar1[6].Error._M_string_length = 0;
  pcVar1[6].Error.field_2._M_local_buf[0] = '\0';
  return pcVar1;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmTryRunCommand; }